

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLRParser.cpp
# Opt level: O0

bool __thiscall
GLRParser::closure(GLRParser *this,
                  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>
                  *markedProductions,
                  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>
                  *allMarkedProductions)

{
  size_t *psVar1;
  undefined8 __lhs;
  bool bVar2;
  __type _Var3;
  int iVar4;
  size_type sVar5;
  iterator __first;
  difference_type dVar6;
  size_type sVar7;
  reference pvVar8;
  iterator __first_00;
  iterator __last;
  iterator iVar9;
  iterator iVar10;
  iterator iVar11;
  iterator iVar12;
  iterator iVar13;
  reference ppPVar14;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar15;
  string *var;
  size_type sVar16;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar17;
  insert_iterator<std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>_>
  iVar18;
  bool local_481;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_400;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3f8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3f0;
  const_iterator local_3e8;
  undefined1 local_3e0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  prodTo2;
  Production *prod;
  iterator __end4;
  iterator __begin4;
  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *__range4;
  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> init;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_350;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_348;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_340;
  const_iterator local_338;
  undefined1 local_330 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  prodTo1;
  int local_2f4;
  _Self local_2f0;
  _Base_ptr local_2e8;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2e0;
  _Self local_2d8;
  string local_2d0 [8];
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  Production *production_1;
  iterator __end1_1;
  iterator __begin1_1;
  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *__range1_1;
  undefined1 local_1e0 [8];
  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> initProductionsFromVar;
  _Self local_198;
  _Base_ptr local_190;
  undefined1 local_188;
  _Self local_180;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_178;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  _Self local_168;
  _Self local_160;
  _Base_ptr local_158;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_150;
  _Self local_148;
  undefined1 local_140 [8];
  string nextChar;
  undefined1 local_108 [4];
  int index;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  it;
  undefined1 local_c0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  prodTo;
  Production *production;
  iterator __end1;
  iterator __begin1;
  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *__range1;
  undefined1 local_80 [4];
  int originalMarkedProductionsSize;
  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> followingTerminalInit;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  terminalsImmRightOfMarker;
  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>
  *allMarkedProductions_local;
  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *markedProductions_local
  ;
  GLRParser *this_local;
  
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&followingTerminalInit._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::set
            ((set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)local_80);
  sVar5 = std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::size
                    (markedProductions);
  __end1 = std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::begin
                     (markedProductions);
  production = (Production *)
               std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::end
                         (markedProductions);
  while (bVar2 = std::operator!=(&__end1,(_Self *)&production), bVar2) {
    ppPVar14 = std::_Rb_tree_const_iterator<Production_*>::operator*(&__end1);
    prodTo.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = &(*ppPVar14)->fromP;
    pvVar15 = Production::getToP_abi_cxx11_
                        ((Production *)
                         prodTo.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_c0,pvVar15);
    local_e0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_c0);
    local_e8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_c0);
    getMarker_abi_cxx11_();
    local_d8 = std::
               find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                         (local_e0,local_e8,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_108);
    std::__cxx11::string::~string((string *)local_108);
    __first = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_c0);
    nextChar.field_2._8_8_ = local_d8._M_current;
    dVar6 = std::
            distance<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                      ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        )__first._M_current,local_d8);
    iVar4 = (int)dVar6;
    sVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_c0);
    if ((ulong)(long)(iVar4 + 1) < sVar7) {
      pvVar8 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_c0,(long)(iVar4 + 1));
      std::__cxx11::string::string((string *)local_140,(string *)pvVar8);
      local_150._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->terminalsT);
      local_158 = (_Base_ptr)
                  std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end(&this->terminalsT);
      local_148._M_node =
           (_Base_ptr)
           std::find<std::_Rb_tree_const_iterator<std::__cxx11::string>,std::__cxx11::string>
                     (local_150,
                      (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )local_158,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140
                     );
      local_160._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->terminalsT);
      bVar2 = std::operator!=(&local_148,&local_160);
      local_481 = false;
      if (bVar2) {
        psVar1 = &followingTerminalInit._M_t._M_impl.super__Rb_tree_header._M_node_count;
        local_170._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)psVar1);
        local_178._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)psVar1);
        pvVar8 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_c0,(long)(iVar4 + 1));
        local_168._M_node =
             (_Base_ptr)
             std::find<std::_Rb_tree_const_iterator<std::__cxx11::string>,std::__cxx11::string>
                       (local_170,local_178,pvVar8);
        local_180._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&followingTerminalInit._M_t._M_impl.super__Rb_tree_header._M_node_count);
        local_481 = std::operator==(&local_168,&local_180);
      }
      if (local_481 == false) {
        __first_00 = std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::begin(&this->nonTerminalsV);
        __last = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(&this->nonTerminalsV);
        local_198._M_node =
             (_Base_ptr)
             std::find<std::_Rb_tree_const_iterator<std::__cxx11::string>,std::__cxx11::string>
                       (__first_00._M_node,__last._M_node,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_140);
        initProductionsFromVar._M_t._M_impl.super__Rb_tree_header._M_node_count =
             (size_t)std::
                     set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end(&this->nonTerminalsV);
        bVar2 = std::operator!=(&local_198,
                                (_Self *)&initProductionsFromVar._M_t._M_impl.super__Rb_tree_header.
                                          _M_node_count);
        if (bVar2) {
          initialProductionsFromVar
                    ((set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)
                     local_1e0,(string *)local_140,allMarkedProductions);
          iVar9 = std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::
                  begin((set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *
                        )local_80);
          iVar10 = std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::
                   end((set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)
                       local_80);
          iVar11 = std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::
                   begin((set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>
                          *)local_1e0);
          iVar12 = std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::
                   end((set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)
                       local_1e0);
          iVar13 = std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::
                   begin((set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>
                          *)local_80);
          iVar18 = std::
                   inserter<std::set<Production*,std::less<Production*>,std::allocator<Production*>>>
                             ((set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>
                               *)local_80,iVar13);
          std::
          set_union<std::_Rb_tree_const_iterator<Production*>,std::_Rb_tree_const_iterator<Production*>,std::insert_iterator<std::set<Production*,std::less<Production*>,std::allocator<Production*>>>>
                    ((_Rb_tree_const_iterator<Production_*>)iVar9._M_node,
                     (_Rb_tree_const_iterator<Production_*>)iVar10._M_node,
                     (_Rb_tree_const_iterator<Production_*>)iVar11._M_node,
                     (_Rb_tree_const_iterator<Production_*>)iVar12._M_node,iVar18);
          std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::~set
                    ((set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)
                     local_1e0);
        }
      }
      else {
        pVar17 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&followingTerminalInit._M_t._M_impl.super__Rb_tree_header._M_node_count
                          ,(value_type *)local_140);
        local_190 = (_Base_ptr)pVar17.first._M_node;
        local_188 = pVar17.second;
      }
      std::__cxx11::string::~string((string *)local_140);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_c0);
    std::_Rb_tree_const_iterator<Production_*>::operator++(&__end1);
  }
  iVar9 = std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::begin
                    (markedProductions);
  iVar10 = std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::end
                     (markedProductions);
  iVar11 = std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::begin
                     ((set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)
                      local_80);
  iVar12 = std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::end
                     ((set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)
                      local_80);
  iVar13 = std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::begin
                     (markedProductions);
  iVar18 = std::inserter<std::set<Production*,std::less<Production*>,std::allocator<Production*>>>
                     (markedProductions,iVar13);
  std::
  set_union<std::_Rb_tree_const_iterator<Production*>,std::_Rb_tree_const_iterator<Production*>,std::insert_iterator<std::set<Production*,std::less<Production*>,std::allocator<Production*>>>>
            ((_Rb_tree_const_iterator<Production_*>)iVar9._M_node,
             (_Rb_tree_const_iterator<Production_*>)iVar10._M_node,
             (_Rb_tree_const_iterator<Production_*>)iVar11._M_node,
             (_Rb_tree_const_iterator<Production_*>)iVar12._M_node,iVar18);
  __end1_1 = std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::begin
                       (allMarkedProductions);
  production_1 = (Production *)
                 std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::end
                           (allMarkedProductions);
  do {
    bVar2 = std::operator!=(&__end1_1,(_Self *)&production_1);
    if (!bVar2) {
      sVar16 = std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::size
                         (markedProductions);
      std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::~set
                ((set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)
                 local_80);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&followingTerminalInit._M_t._M_impl.super__Rb_tree_header._M_node_count);
      return (long)(int)sVar5 != sVar16;
    }
    ppPVar14 = std::_Rb_tree_const_iterator<Production_*>::operator*(&__end1_1);
    __range2 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)*ppPVar14;
    pvVar15 = Production::getToP_abi_cxx11_((Production *)__range2);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(pvVar15);
    c = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(pvVar15);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&c), bVar2) {
      str.field_2._8_8_ =
           __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end2);
      std::__cxx11::string::string(local_2d0);
      psVar1 = &followingTerminalInit._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_2e0._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)psVar1);
      local_2e8 = (_Base_ptr)
                  std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)psVar1);
      local_2d8._M_node =
           (_Base_ptr)
           std::find<std::_Rb_tree_const_iterator<std::__cxx11::string>,std::__cxx11::string>
                     (local_2e0,
                      (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )local_2e8,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      str.field_2._8_8_);
      local_2f0._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&followingTerminalInit._M_t._M_impl.super__Rb_tree_header._M_node_count);
      bVar2 = std::operator==(&local_2d8,&local_2f0);
      __lhs = str.field_2._8_8_;
      if (bVar2) {
        local_2f4 = 6;
      }
      else {
        getMarker_abi_cxx11_();
        _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&prodTo1.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::~string
                  ((string *)
                   &prodTo1.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (_Var3) {
          pvVar15 = Production::getToP_abi_cxx11_((Production *)__range2);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_330,pvVar15);
          local_348._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_330);
          local_350._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_330);
          getMarker_abi_cxx11_();
          local_340 = std::
                      find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                                (local_348,local_350,&local_370);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          ::__normal_iterator<std::__cxx11::string*>
                    ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      *)&local_338,&local_340);
          init._M_t._M_impl.super__Rb_tree_header._M_node_count =
               (size_t)std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_330,local_338);
          std::__cxx11::string::~string((string *)&local_370);
          var = Production::getFromP_abi_cxx11_((Production *)__range2);
          initialProductionsFromVar
                    ((set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)
                     &__range4,var,allMarkedProductions);
          __end4 = std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::
                   begin((set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>
                          *)&__range4);
          prod = (Production *)
                 std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::end
                           ((set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>
                             *)&__range4);
          while (bVar2 = std::operator!=(&__end4,(_Self *)&prod), bVar2) {
            ppPVar14 = std::_Rb_tree_const_iterator<Production_*>::operator*(&__end4);
            prodTo2.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = &(*ppPVar14)->fromP;
            pvVar15 = Production::getToP_abi_cxx11_
                                ((Production *)
                                 prodTo2.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_3e0,pvVar15);
            local_3f8._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_3e0);
            local_400._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_3e0);
            getMarker_abi_cxx11_();
            local_3f0 = std::
                        find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                                  (local_3f8,local_400,&local_420);
            __gnu_cxx::
            __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ::__normal_iterator<std::__cxx11::string*>
                      ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                        *)&local_3e8,&local_3f0);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::erase((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_3e0,local_3e8);
            std::__cxx11::string::~string((string *)&local_420);
            bVar2 = std::operator==((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_330,
                                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)local_3e0);
            if (bVar2) {
              std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::insert
                        (markedProductions,(value_type *)&__range2);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_3e0);
            std::_Rb_tree_const_iterator<Production_*>::operator++(&__end4);
          }
          local_2f4 = 6;
          std::set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>::~set
                    ((set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)
                     &__range4);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_330);
        }
        else {
          std::__cxx11::string::operator+=(local_2d0,(string *)str.field_2._8_8_);
          local_2f4 = 0;
        }
      }
      std::__cxx11::string::~string(local_2d0);
      if (local_2f4 != 0) break;
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::_Rb_tree_const_iterator<Production_*>::operator++(&__end1_1);
  } while( true );
}

Assistant:

bool GLRParser::closure(std::set<Production *> &markedProductions, std::set<Production *> &allMarkedProductions) {
    std::set<std::string> terminalsImmRightOfMarker;
    std::set<Production *> followingTerminalInit;
    int originalMarkedProductionsSize = markedProductions.size();
    for (auto production: markedProductions) {
        std::vector<std::string> prodTo = production->getToP();
        auto it = std::find(prodTo.begin(), prodTo.end(), getMarker());
        // find the index
        int index = std::distance(prodTo.begin(), it);

        // Find the character to the immidiate right
        if (index + 1 < prodTo.size()) {
            // Check whether it's a terminal and whether it isn't included yet in the list
            std::string nextChar = prodTo.at(index + 1);
            if (std::find(terminalsT.begin(), terminalsT.end(), nextChar) != terminalsT.end() &&
                std::find(terminalsImmRightOfMarker.begin(), terminalsImmRightOfMarker.end(), prodTo.at(index + 1)) ==
                terminalsImmRightOfMarker.end()) {
                terminalsImmRightOfMarker.insert(nextChar);
//                changed = true;
            } else if (std::find(nonTerminalsV.begin(), nonTerminalsV.end(), nextChar) != nonTerminalsV.end()) {
                std::set<Production *> initProductionsFromVar = initialProductionsFromVar(nextChar,
                                                                                          allMarkedProductions);
//                for(auto prod: initProductionsFromVar){
//                    followingTerminalInit.insert(prod);
//                }
                set_union(followingTerminalInit.begin(), followingTerminalInit.end(), initProductionsFromVar.begin(),
                          initProductionsFromVar.end(),
                          std::inserter(followingTerminalInit, followingTerminalInit.begin()));
            }
        }
    }

    set_union(markedProductions.begin(), markedProductions.end(), followingTerminalInit.begin(),
              followingTerminalInit.end(), std::inserter(markedProductions, markedProductions.begin()));

    // "Then, we add to the set the initial forms of all rewrite rules in the grammar whose left-hand sides consist of
    // those nonterminals as well." -> What do they mean with consists of? Contains all of them? Only contains those? ...
    for (auto production: allMarkedProductions) {
        for (const auto &c: production->getToP()) {
            std::string str;
            if (std::find(terminalsImmRightOfMarker.begin(), terminalsImmRightOfMarker.end(), c) ==
                terminalsImmRightOfMarker.end()) {
                // The char is not in the list with specified terminals
                break;
            }
            if (c == getMarker()) {
                // this must only be the production of the form of the current production, not all first productions
                auto prodTo1 = production->getToP();
                prodTo1.erase(std::find(prodTo1.begin(), prodTo1.end(), getMarker()));
                std::set<Production *> init = initialProductionsFromVar(production->getFromP(), allMarkedProductions);
                for (auto prod: init) {
                    auto prodTo2 = prod->getToP();
                    prodTo2.erase(std::find(prodTo2.begin(), prodTo2.end(), getMarker()));
                    if (prodTo1 == prodTo2) { // TODO: check if still working (changed from if true)
                        markedProductions.insert(production);
//                        changed = true;
                    }
                }
                break;
            }
            str += c;
        }
    }

    // return whether anything has been changed

    return originalMarkedProductionsSize != markedProductions.size();
}